

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFFAdapter.cpp
# Opt level: O0

UFFAtypeParameters * __thiscall OpenMD::UFFAdapter::getUFFParam(UFFAdapter *this)

{
  bool bVar1;
  undefined8 uVar2;
  element_type *this_00;
  UFFAtypeParameters *__src;
  UFFAtypeParameters *in_RDI;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>_> uffData;
  shared_ptr<OpenMD::GenericData> data;
  AtomType *in_stack_ffffffffffffff28;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff30;
  string *psVar3;
  string *in_stack_ffffffffffffff40;
  errorStruct *in_stack_ffffffffffffff48;
  string local_98 [64];
  string local_58 [48];
  string local_28 [40];
  
  bVar1 = isUFF((UFFAdapter *)0x2c9bcb);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "UFFAdapter::getUFFParam was passed an atomType (%s)\n\tthat does not appear to be a UFF atom.\n"
             ,uVar2);
    std::__cxx11::string::~string(local_28);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    psVar3 = local_58;
    uVar2 = std::__cxx11::string::c_str();
    in_stack_ffffffffffffff48 = &painCave;
    snprintf(painCave.errMsg,2000,
             "UFFAdapter::getUFFParam could not find UFF\n\tparameters for atomType %s.\n",uVar2);
    std::__cxx11::string::~string(psVar3);
    *(undefined4 *)((long)in_stack_ffffffffffffff48->errMsg + 0x7d4) = 1;
    *(undefined4 *)((long)in_stack_ffffffffffffff48->errMsg + 2000) = 1;
    simError();
  }
  std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>,OpenMD::GenericData>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff48);
  bVar1 = std::operator==((shared_ptr<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>_> *)
                          in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    psVar3 = local_98;
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "UFFAdapter::getUFFParam could not convert\n\tGenericData to UFFAtypeData for atom type %s\n"
             ,uVar2);
    std::__cxx11::string::~string(psVar3);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  this_00 = std::
            __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2c9dc0);
  __src = SimpleTypeData<OpenMD::UFFAtypeParameters>::getData(this_00);
  memcpy(in_RDI,__src,0x58);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>_> *)0x2c9deb);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2c9df8);
  return in_RDI;
}

Assistant:

UFFAtypeParameters UFFAdapter::getUFFParam() {
    if (!isUFF()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "UFFAdapter::getUFFParam was passed an atomType (%s)\n"
               "\tthat does not appear to be a UFF atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(UFFtypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "UFFAdapter::getUFFParam could not find UFF\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<UFFAtypeData> uffData =
        std::dynamic_pointer_cast<UFFAtypeData>(data);
    if (uffData == NULL) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "UFFAdapter::getUFFParam could not convert\n"
               "\tGenericData to UFFAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return uffData->getData();
  }